

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<float,int,float,duckdb::BinaryStandardOperatorWrapper,duckdb::RoundOperatorPrecision,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  int iVar1;
  unsigned_long *puVar2;
  float *pfVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pfVar3 = (float *)result->data;
  if (((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) &&
     ((puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 == (unsigned_long *)0x0 || ((*puVar2 & 1) != 0)))) {
    fVar6 = *(float *)left->data;
    iVar1 = *(int *)right->data;
    if (iVar1 < 0) {
      dVar4 = pow(10.0,(double)-(float)iVar1);
      dVar5 = round((double)fVar6 / dVar4);
      dVar5 = dVar5 * dVar4;
      fVar6 = 0.0;
    }
    else {
      dVar4 = pow(10.0,(double)iVar1);
      dVar5 = round((double)fVar6 * dVar4);
      dVar5 = dVar5 / dVar4;
    }
    if ((ulong)ABS(dVar5) < 0x7ff0000000000000) {
      fVar6 = (float)dVar5;
    }
    *pfVar3 = fVar6;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}